

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::MergePartialFromCodedStream
          (SoundAnalysisPreprocessing *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  undefined8 in_RAX;
  SoundAnalysisPreprocessing_Vggish *this_00;
  ulong extraout_RAX;
  uint uVar6;
  ulong uVar7;
  int local_34;
  
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar7 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_004da6b6;
        uVar7 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar7 = uVar7 | 0x100000000;
    }
    else {
LAB_004da6b6:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar7 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar7 = 0x100000000;
      }
      uVar7 = uVar5 | uVar7;
    }
    uVar6 = (uint)uVar7;
    if (((uVar7 & 0x100000000) == 0) || ((char)uVar7 != -0x5e || (uVar6 & 0xfffffff8) != 0xa0)) {
      local_34 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
        if (bVar4) goto LAB_004da66a;
        local_34 = 6;
      }
    }
    else {
      if (this->_oneof_case_[0] != 0x14) {
        this->_oneof_case_[0] = 0x14;
        this_00 = (SoundAnalysisPreprocessing_Vggish *)operator_new(0x18);
        SoundAnalysisPreprocessing_Vggish::SoundAnalysisPreprocessing_Vggish(this_00);
        (this->SoundAnalysisPreprocessingType_).vggish_ = this_00;
      }
      MergePartialFromCodedStream();
      if ((extraout_RAX & 1) == 0) {
LAB_004da66a:
        local_34 = 0;
      }
      else {
        local_34 = (int)((ulong)in_RAX >> 0x20);
      }
    }
    if (local_34 != 0) {
      return local_34 != 6;
    }
  } while( true );
}

Assistant:

bool SoundAnalysisPreprocessing::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish vggish = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_vggish()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  return false;
#undef DO_
}